

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationKeyFrame
          (OgreBinarySerializer *this,VertexAnimationTrack *dest)

{
  pointer *ppTVar1;
  float *pfVar2;
  int8_t *piVar3;
  iterator __position;
  TransformKeyFrame keyframe;
  TransformKeyFrame local_4c;
  
  TransformKeyFrame::TransformKeyFrame(&local_4c);
  local_4c.timePos = StreamReader<false,_false>::Get<float>(this->m_reader);
  pfVar2 = (float *)this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,(int8_t *)(pfVar2 + 4));
  local_4c.rotation.x = *pfVar2;
  local_4c.rotation.y = pfVar2[1];
  local_4c.rotation.z = pfVar2[2];
  local_4c.rotation.w = pfVar2[3];
  piVar3 = this->m_reader->current;
  StreamReader<false,_false>::SetPtr(this->m_reader,piVar3 + 0xc);
  local_4c.position.z = *(float *)(piVar3 + 8);
  local_4c.position.x = (float)*(undefined8 *)piVar3;
  local_4c.position.y = (float)((ulong)*(undefined8 *)piVar3 >> 0x20);
  if (0x26 < this->m_currentLen) {
    piVar3 = this->m_reader->current;
    StreamReader<false,_false>::SetPtr(this->m_reader,piVar3 + 0xc);
    local_4c.scale.z = *(float *)(piVar3 + 8);
    local_4c.scale.x = (float)*(undefined8 *)piVar3;
    local_4c.scale.y = (float)((ulong)*(undefined8 *)piVar3 >> 0x20);
  }
  __position._M_current =
       (dest->transformKeyFrames).
       super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (dest->transformKeyFrames).
      super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>>::
    _M_realloc_insert<Assimp::Ogre::TransformKeyFrame_const&>
              ((vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>>
                *)&dest->transformKeyFrames,__position,&local_4c);
  }
  else {
    *(ulong *)&((__position._M_current)->position).z =
         CONCAT44(local_4c.scale.x,local_4c.position.z);
    ((__position._M_current)->scale).y = local_4c.scale.y;
    ((__position._M_current)->scale).z = local_4c.scale.z;
    *(ulong *)&((__position._M_current)->rotation).z =
         CONCAT44(local_4c.position.x,local_4c.rotation.z);
    ((__position._M_current)->position).y = local_4c.position.y;
    ((__position._M_current)->position).z = local_4c.position.z;
    (__position._M_current)->timePos = local_4c.timePos;
    ((__position._M_current)->rotation).w = local_4c.rotation.w;
    ((__position._M_current)->rotation).x = local_4c.rotation.x;
    ((__position._M_current)->rotation).y = local_4c.rotation.y;
    ppTVar1 = &(dest->transformKeyFrames).
               super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationKeyFrame(VertexAnimationTrack *dest)
{
    TransformKeyFrame keyframe;
    keyframe.timePos = Read<float>();

    // Rot and pos
    ReadQuaternion(keyframe.rotation);
    ReadVector(keyframe.position);

    // Scale (optional)
    if (m_currentLen > MSTREAM_KEYFRAME_SIZE_WITHOUT_SCALE)
        ReadVector(keyframe.scale);

    dest->transformKeyFrames.push_back(keyframe);
}